

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::TrackObjTypeSpecWriteGuards
          (BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  Type pJVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *pHVar4;
  StackSym *pSVar5;
  ObjWriteGuardBucket *pOVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  PropertySym *pPVar8;
  undefined4 *puVar9;
  PropertySym *pPVar10;
  
  if (this->tag == BackwardPhase) {
    bVar3 = IR::PropertySymOpnd::IsMono(opnd);
    if (bVar3) {
      bVar3 = IR::PropertySymOpnd::MayNeedWriteGuardProtection(opnd);
      if (bVar3) {
        pHVar4 = block->stackSymToWriteGuardsMap;
        if (pHVar4 == (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0) {
          pHVar4 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::New
                             (&this->tempAlloc->super_ArenaAllocator,8);
          block->stackSymToWriteGuardsMap = pHVar4;
        }
        pSVar5 = IR::PropertySymOpnd::GetObjectSym(opnd);
        pOVar6 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                           (pHVar4,(pSVar5->super_Sym).m_id);
        pBVar7 = pOVar6->writeGuards;
        if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
                   new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3d6ef4);
          pJVar1 = this->tempAlloc;
          pBVar7->head = (Type_conflict)0x0;
          pBVar7->lastFoundIndex = (Type_conflict)0x0;
          pBVar7->alloc = pJVar1;
          pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
          pOVar6->writeGuards = pBVar7;
        }
        pPVar8 = Sym::AsPropertySym((opnd->super_SymOpnd).m_sym);
        pPVar10 = pPVar8->m_writeGuardSym;
        if (pPVar10 == (PropertySym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x165c,"(propertySym->m_writeGuardSym != nullptr)",
                             "propertySym->m_writeGuardSym != nullptr");
          if (!bVar3) goto LAB_003d2cad;
          *puVar9 = 0;
          pPVar10 = pPVar8->m_writeGuardSym;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(pBVar7,(pPVar10->super_Sym).m_id);
      }
    }
    if (this->currentPrePassLoop == (Loop *)0x0) {
      bVar3 = IR::PropertySymOpnd::IsMono(opnd);
      if ((bVar3) && (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 4) == 0)) {
        if (opnd->writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1666,"(opnd->GetWriteGuards() == nullptr)",
                             "opnd->GetWriteGuards() == nullptr");
          if (!bVar3) {
LAB_003d2cad:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
        pHVar4 = block->stackSymToWriteGuardsMap;
        if (pHVar4 != (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0) {
          pSVar5 = IR::PropertySymOpnd::GetObjectSym(opnd);
          pOVar6 = HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Get
                             (pHVar4,(pSVar5->super_Sym).m_id);
          if (pOVar6 != (ObjWriteGuardBucket *)0x0) {
            pBVar7 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                               (pOVar6->writeGuards,this->func->m_alloc);
            BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                      (pBVar7,block->upwardExposedFields);
            IR::PropertySymOpnd::SetWriteGuards(opnd,pBVar7);
            return;
          }
        }
      }
    }
  }
  else {
    bVar3 = IR::PropertySymOpnd::MayNeedWriteGuardProtection(opnd);
    if ((bVar3) && (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0)) {
      propertyId = IR::PropertySymOpnd::GetPropertyId(opnd);
      bVar3 = MayPropertyBeWrittenTo(this,propertyId);
      if (!bVar3) {
        IR::PropertySymOpnd::SetWriteGuardChecked(opnd,true);
      }
    }
    if (this->currentPrePassLoop == (Loop *)0x0) {
      bVar3 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(opnd);
      if (!bVar3) {
        opnd->writeGuards = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecWriteGuards(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // TODO (ObjTypeSpec): Move write guard tracking to the forward pass, by recording on the type value
    // which property IDs have been written since the last type check. This will result in more accurate
    // tracking in cases when object pointer copy prop kicks in.
    if (this->tag == Js::BackwardPhase)
    {
        // If this operation may need a write guard (load from proto or fixed field check) then add its
        // write guard symbol to the map for this object. If it remains live (hasn't been written to)
        // until the type check upstream, it will get recorded there so that the type check can be registered
        // for invalidation on this property used in this operation.

        // (ObjTypeSpec): Consider supporting polymorphic write guards as well. We can't currently distinguish between mono and
        // poly write guards, and a type check can only protect operations matching with respect to polymorphism (see
        // BackwardPass::TrackObjTypeSpecProperties for details), so for now we only target monomorphic operations.
        if (opnd->IsMono() && opnd->MayNeedWriteGuardProtection())
        {
            if (block->stackSymToWriteGuardsMap == nullptr)
            {
                block->stackSymToWriteGuardsMap = HashTable<ObjWriteGuardBucket>::New(this->tempAlloc, 8);
            }

            ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->FindOrInsertNew(opnd->GetObjectSym()->m_id);

            BVSparse<JitArenaAllocator>* writeGuards = bucket->GetWriteGuards();
            if (writeGuards == nullptr)
            {
                // The bit vectors we push around the flow graph only need to live as long as this phase.
                writeGuards = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                bucket->SetWriteGuards(writeGuards);
            }

            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            Assert(propertySym->m_writeGuardSym != nullptr);
            SymID writeGuardSymId = propertySym->m_writeGuardSym->m_id;
            writeGuards->Set(writeGuardSymId);
        }

        // Record any live (upward exposed) write guards on this operation, if this operation may end up with
        // a type check.  If we ultimately don't need a type check here, we will simply ignore the guards, because
        // an earlier type check will protect them.
        if (!IsPrePass() && opnd->IsMono() && !opnd->IsTypeDead())
        {
            Assert(opnd->GetWriteGuards() == nullptr);
            if (block->stackSymToWriteGuardsMap != nullptr)
            {
                ObjWriteGuardBucket* bucket = block->stackSymToWriteGuardsMap->Get(opnd->GetObjectSym()->m_id);
                if (bucket != nullptr)
                {
                    // Get all the write guards associated with this object sym and filter them down to those that
                    // are upward exposed. If we end up emitting a type check for this instruction, we will create
                    // a type property guard registered for all guarded proto properties and we will set the write
                    // guard syms live during forward pass, such that we can avoid unnecessary write guard type
                    // checks and bailouts on every proto property (as long as it hasn't been written to since the
                    // primary type check).
                    auto writeGuards = bucket->GetWriteGuards()->CopyNew(this->func->m_alloc);
                    writeGuards->And(block->upwardExposedFields);
                    opnd->SetWriteGuards(writeGuards);
                }
            }
        }
    }
    else
    {
        // If we know this property has never been written to in this function (either on this object or any
        // of its aliases) we don't need the local type check.
        if (opnd->MayNeedWriteGuardProtection() && !opnd->IsWriteGuardChecked() && !MayPropertyBeWrittenTo(opnd->GetPropertyId()))
        {
            opnd->SetWriteGuardChecked(true);
        }

        // If we don't need a primary type check here let's clear the write guards. The primary type check upstream will
        // register the type check for the corresponding properties.
        if (!IsPrePass() && !opnd->NeedsPrimaryTypeCheck())
        {
            opnd->ClearWriteGuards();
        }
    }
}